

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

void __thiscall
libtorrent::save_resume_data_failed_alert::save_resume_data_failed_alert
          (save_resume_data_failed_alert *this,stack_allocator *alloc,torrent_handle *h,
          error_code *e)

{
  error_category *peVar1;
  bool bVar2;
  undefined3 uVar3;
  string local_48;
  error_code *local_28;
  error_code *e_local;
  torrent_handle *h_local;
  stack_allocator *alloc_local;
  save_resume_data_failed_alert *this_local;
  
  local_28 = e;
  e_local = (error_code *)h;
  h_local = (torrent_handle *)alloc;
  alloc_local = (stack_allocator *)this;
  torrent_alert::torrent_alert(&this->super_torrent_alert,alloc,h);
  (this->super_torrent_alert).super_alert._vptr_alert =
       (_func_int **)&PTR__save_resume_data_failed_alert_00990e80;
  bVar2 = local_28->failed_;
  uVar3 = *(undefined3 *)&local_28->field_0x5;
  peVar1 = local_28->cat_;
  (this->error).val_ = local_28->val_;
  (this->error).failed_ = bVar2;
  *(undefined3 *)&(this->error).field_0x5 = uVar3;
  (this->error).cat_ = peVar1;
  boost::system::error_code::message_abi_cxx11_(&local_48,&this->error);
  convert_from_native(&this->msg,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

save_resume_data_failed_alert::save_resume_data_failed_alert(aux::stack_allocator& alloc
		, torrent_handle const& h, error_code const& e)
		: torrent_alert(alloc, h)
		, error(e)
#if TORRENT_ABI_VERSION == 1
		, msg(convert_from_native(error.message()))
#endif
	{
	}